

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O1

bool __thiscall
ArmParser::decodeArmOpcode(ArmParser *this,string *name,tArmOpcode *opcode,ArmOpcodeVariables *vars)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  byte *pbVar5;
  bool bVar6;
  size_t pos;
  size_t local_30;
  
  (vars->Opcode).c = '\0';
  (vars->Opcode).a = '\0';
  (vars->Opcode).s = false;
  pbVar5 = (byte *)opcode->name;
  local_30 = 0;
  bVar2 = *pbVar5;
  if (bVar2 != 0) {
    do {
      pbVar5 = pbVar5 + 1;
      if (bVar2 < 0x53) {
        if (bVar2 == 0x41) {
          bVar6 = decodeAddressingMode(this,name,&local_30,&(vars->Opcode).a);
          if (!bVar6) {
            return false;
          }
        }
        else if (bVar2 == 0x43) {
          iVar4 = decodeCondition(this,name,&local_30);
          (vars->Opcode).c = (uchar)iVar4;
        }
        else {
LAB_00161659:
          if ((name->_M_string_length <= local_30) ||
             (pbVar1 = (byte *)((name->_M_dataplus)._M_p + local_30), local_30 = local_30 + 1,
             bVar2 != *pbVar1)) {
            return false;
          }
        }
      }
      else if (bVar2 == 0x53) {
        if (local_30 < name->_M_string_length) {
          bVar6 = (name->_M_dataplus)._M_p[local_30] == 's';
          (vars->Opcode).s = bVar6;
          if (bVar6) goto LAB_0016163b;
        }
        else {
          (vars->Opcode).s = false;
        }
      }
      else {
        if (bVar2 == 0x58) {
          if (name->_M_string_length <= local_30) {
            return false;
          }
          cVar3 = (name->_M_dataplus)._M_p[local_30];
          bVar6 = true;
          if (cVar3 != 't') {
            if (cVar3 != 'b') {
              return false;
            }
            bVar6 = false;
          }
          (vars->Opcode).x = bVar6;
        }
        else {
          if (bVar2 != 0x59) goto LAB_00161659;
          if (name->_M_string_length <= local_30) {
            return false;
          }
          cVar3 = (name->_M_dataplus)._M_p[local_30];
          bVar6 = true;
          if (cVar3 != 't') {
            if (cVar3 != 'b') {
              return false;
            }
            bVar6 = false;
          }
          (vars->Opcode).y = bVar6;
        }
LAB_0016163b:
        local_30 = local_30 + 1;
      }
      bVar2 = *pbVar5;
    } while (bVar2 != 0);
  }
  return name->_M_string_length <= local_30;
}

Assistant:

bool ArmParser::decodeArmOpcode(const std::string& name, const tArmOpcode& opcode, ArmOpcodeVariables& vars)
{
	vars.Opcode.c = vars.Opcode.a = 0;
	vars.Opcode.s = false;

	const char* encoding = opcode.name;
	size_t pos = 0;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 'C':	// condition
			vars.Opcode.c = decodeCondition(name,pos);
			break;
		case 'S':	// set flag
			decodeS(name,pos,vars.Opcode.s);
			break;
		case 'A':	// addressing mode
			CHECK(decodeAddressingMode(name,pos,vars.Opcode.a));
			break;
		case 'X':	// x flag
			CHECK(decodeXY(name,pos,vars.Opcode.x));
			break;
		case 'Y':	// y flag
			CHECK(decodeXY(name,pos,vars.Opcode.y));
			break;
		default:
			CHECK(pos < name.size());
			CHECK(*(encoding-1) == name[pos++]);
			break;
		}
	}

	return pos >= name.size();
}